

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O0

void __thiscall
t_dart_generator::generate_serialize_field
          (t_dart_generator *this,ostream *out,t_field *tfield,string *prefix)

{
  byte bVar1;
  t_type *type_00;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  ostream *poVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined1 auVar8 [12];
  string local_158;
  undefined1 local_131;
  string local_130;
  t_base local_10c;
  undefined1 local_108 [4];
  t_base tbase;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_70;
  undefined1 local_50 [8];
  string field_name;
  t_type *type;
  string *prefix_local;
  t_field *tfield_local;
  ostream *out_local;
  t_dart_generator *this_local;
  
  type_00 = t_field::get_type(tfield);
  field_name.field_2._8_8_ = t_generator::get_true_type(type_00);
  psVar2 = t_field::get_name_abi_cxx11_(tfield);
  std::__cxx11::string::string((string *)&local_70,(string *)psVar2);
  get_member_name((string *)local_50,this,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = (**(code **)(*(long *)field_name.field_2._8_8_ + 0x20))();
  if ((bVar1 & 1) == 0) {
    bVar1 = (**(code **)(*(long *)field_name.field_2._8_8_ + 0x58))();
    if (((bVar1 & 1) == 0) &&
       (bVar1 = (**(code **)(*(long *)field_name.field_2._8_8_ + 0x60))(), (bVar1 & 1) == 0)) {
      bVar1 = (**(code **)(*(long *)field_name.field_2._8_8_ + 0x68))();
      uVar5 = field_name.field_2._8_8_;
      if ((bVar1 & 1) == 0) {
        bVar1 = (**(code **)(*(long *)field_name.field_2._8_8_ + 0x28))();
        if (((bVar1 & 1) == 0) &&
           (bVar1 = (**(code **)(*(long *)field_name.field_2._8_8_ + 0x50))(), (bVar1 & 1) == 0)) {
          uVar5 = std::__cxx11::string::c_str();
          uVar6 = std::__cxx11::string::c_str();
          type_name_abi_cxx11_(&local_158,this,(t_type *)field_name.field_2._8_8_);
          uVar7 = std::__cxx11::string::c_str();
          printf("DO NOT KNOW HOW TO SERIALIZE FIELD \'%s%s\' TYPE \'%s\'\n",uVar5,uVar6,uVar7);
          std::__cxx11::string::~string((string *)&local_158);
        }
        else {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_108,prefix,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_50);
          poVar4 = t_generator::indent((t_generator *)this,out);
          std::operator<<(poVar4,"oprot.");
          bVar1 = (**(code **)(*(long *)field_name.field_2._8_8_ + 0x28))();
          if ((bVar1 & 1) == 0) {
            bVar1 = (**(code **)(*(long *)field_name.field_2._8_8_ + 0x50))();
            if ((bVar1 & 1) != 0) {
              poVar4 = std::operator<<(out,"writeI32(");
              poVar4 = std::operator<<(poVar4,(string *)local_108);
              std::operator<<(poVar4,");");
            }
          }
          else {
            local_10c = t_base_type::get_base((t_base_type *)field_name.field_2._8_8_);
            switch(local_10c) {
            case TYPE_VOID:
              pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       __cxa_allocate_exception(0x20);
              std::operator+(pbVar3,"compiler error: cannot serialize void field in a struct: ",
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_108);
              __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
            case TYPE_STRING:
              bVar1 = (**(code **)(*(long *)field_name.field_2._8_8_ + 0x38))();
              if ((bVar1 & 1) == 0) {
                poVar4 = std::operator<<(out,"writeString(");
                poVar4 = std::operator<<(poVar4,(string *)local_108);
                std::operator<<(poVar4,");");
              }
              else {
                poVar4 = std::operator<<(out,"writeBinary(");
                poVar4 = std::operator<<(poVar4,(string *)local_108);
                std::operator<<(poVar4,");");
              }
              break;
            case TYPE_BOOL:
              poVar4 = std::operator<<(out,"writeBool(");
              poVar4 = std::operator<<(poVar4,(string *)local_108);
              std::operator<<(poVar4,");");
              break;
            case TYPE_I8:
              poVar4 = std::operator<<(out,"writeByte(");
              poVar4 = std::operator<<(poVar4,(string *)local_108);
              std::operator<<(poVar4,");");
              break;
            case TYPE_I16:
              poVar4 = std::operator<<(out,"writeI16(");
              poVar4 = std::operator<<(poVar4,(string *)local_108);
              std::operator<<(poVar4,");");
              break;
            case TYPE_I32:
              poVar4 = std::operator<<(out,"writeI32(");
              poVar4 = std::operator<<(poVar4,(string *)local_108);
              std::operator<<(poVar4,");");
              break;
            case TYPE_I64:
              poVar4 = std::operator<<(out,"writeI64(");
              poVar4 = std::operator<<(poVar4,(string *)local_108);
              std::operator<<(poVar4,");");
              break;
            case TYPE_DOUBLE:
              poVar4 = std::operator<<(out,"writeDouble(");
              poVar4 = std::operator<<(poVar4,(string *)local_108);
              std::operator<<(poVar4,");");
              break;
            default:
              local_131 = 1;
              auVar8 = __cxa_allocate_exception(0x20);
              t_base_type::t_base_name_abi_cxx11_
                        (&local_130,(t_base_type *)(ulong)local_10c,auVar8._8_4_);
              std::operator+(auVar8._0_8_,"compiler error: no Dart name for base type ",&local_130);
              local_131 = 0;
              __cxa_throw(auVar8._0_8_,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string
                         );
            }
          }
          std::operator<<(out,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)local_108);
        }
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&name.field_2 + 8),prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                      );
        generate_serialize_container(this,out,(t_type *)uVar5,(string *)((long)&name.field_2 + 8));
        std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
      }
    }
    else {
      uVar5 = field_name.field_2._8_8_;
      std::operator+(&local_c8,prefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
      generate_serialize_struct(this,out,(t_struct *)uVar5,&local_c8);
      std::__cxx11::string::~string((string *)&local_c8);
    }
    std::__cxx11::string::~string((string *)local_50);
    return;
  }
  local_a1 = 1;
  pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           __cxa_allocate_exception(0x20);
  std::operator+(&local_a0,"CANNOT GENERATE SERIALIZE CODE FOR void TYPE: ",prefix);
  std::operator+(pbVar3,&local_a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50);
  local_a1 = 0;
  __cxa_throw(pbVar3,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void t_dart_generator::generate_serialize_field(ostream& out, t_field* tfield, string prefix) {
  t_type* type = get_true_type(tfield->get_type());
  string field_name = get_member_name(tfield->get_name());

  // Do nothing for void types
  if (type->is_void()) {
    throw "CANNOT GENERATE SERIALIZE CODE FOR void TYPE: " + prefix + field_name;
  }

  if (type->is_struct() || type->is_xception()) {
    generate_serialize_struct(out, (t_struct*)type, prefix + field_name);
  } else if (type->is_container()) {
    generate_serialize_container(out, type, prefix + field_name);
  } else if (type->is_base_type() || type->is_enum()) {

    string name = prefix + field_name;
    indent(out) << "oprot.";

    if (type->is_base_type()) {
      t_base_type::t_base tbase = ((t_base_type*)type)->get_base();
      switch (tbase) {
      case t_base_type::TYPE_VOID:
        throw "compiler error: cannot serialize void field in a struct: " + name;
        break;
      case t_base_type::TYPE_STRING:
        if (type->is_binary()) {
          out << "writeBinary(" << name << ");";
        } else {
          out << "writeString(" << name << ");";
        }
        break;
      case t_base_type::TYPE_BOOL:
        out << "writeBool(" << name << ");";
        break;
      case t_base_type::TYPE_I8:
        out << "writeByte(" << name << ");";
        break;
      case t_base_type::TYPE_I16:
        out << "writeI16(" << name << ");";
        break;
      case t_base_type::TYPE_I32:
        out << "writeI32(" << name << ");";
        break;
      case t_base_type::TYPE_I64:
        out << "writeI64(" << name << ");";
        break;
      case t_base_type::TYPE_DOUBLE:
        out << "writeDouble(" << name << ");";
        break;
      default:
        throw "compiler error: no Dart name for base type " + t_base_type::t_base_name(tbase);
      }
    } else if (type->is_enum()) {
      out << "writeI32(" << name << ");";
    }
    out << endl;
  } else {
    printf("DO NOT KNOW HOW TO SERIALIZE FIELD '%s%s' TYPE '%s'\n",
           prefix.c_str(),
           field_name.c_str(),
           type_name(type).c_str());
  }
}